

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

GLboolean checkExtension(char *extName,GLubyte *extString)

{
  char cVar1;
  char *pcVar2;
  char *pcStack_30;
  char c;
  char *q;
  char *p;
  GLubyte *extString_local;
  char *extName_local;
  
  pcStack_30 = extName;
  q = (char *)extString;
  do {
    cVar1 = *q;
    if ((cVar1 == '\0') || (cVar1 == ' ')) {
      pcVar2 = extName;
      if ((pcStack_30 != (char *)0x0) && (pcVar2 = extName, *pcStack_30 == '\0')) {
        return '\x01';
      }
    }
    else if ((pcStack_30 == (char *)0x0) || (*pcStack_30 != cVar1)) {
      pcStack_30 = (char *)0x0;
      pcVar2 = pcStack_30;
    }
    else {
      pcVar2 = pcStack_30 + 1;
    }
    pcStack_30 = pcVar2;
    q = q + 1;
    if (cVar1 == '\0') {
      return '\0';
    }
  } while( true );
}

Assistant:

static GLboolean
checkExtension(const char *extName, const GLubyte *extString)
{
   const char *p = (const char *)extString;
   const char *q = extName;
   char c;
   do {
       c = *p++;
       if (c == '\0' || c == ' ') {
           if (q && *q == '\0') {
               return GL_TRUE;
           } else {
               q = extName;
           }
       } else {
           if (q && *q == c) {
               ++q;
           } else {
               q = 0;
           }
       }
   } while (c);
   return GL_FALSE;
}